

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment_variable.c
# Opt level: O0

char * environment_variable_create(char *name,char *default_value)

{
  size_t __n;
  char *in_RSI;
  char *in_RDI;
  size_t length;
  char *variable;
  char *variable_ptr;
  char *local_20;
  char *local_18;
  char *local_8;
  
  local_20 = getenv(in_RDI);
  if (local_20 == (char *)0x0) {
    local_18 = in_RSI;
    if (in_RSI == (char *)0x0) {
      local_18 = "";
    }
    local_20 = local_18;
  }
  __n = strlen(local_20);
  local_8 = (char *)malloc(__n + 1);
  if (local_8 == (char *)0x0) {
    local_8 = (char *)0x0;
  }
  else {
    strncpy(local_8,local_20,__n);
    local_8[__n] = '\0';
  }
  return local_8;
}

Assistant:

char *environment_variable_create(const char *name, const char *default_value)
{
	const char *variable_ptr = getenv(name);

	char *variable;

	size_t length;

	if (variable_ptr == NULL)
	{
		if (default_value == NULL)
		{
			static const char empty_variable[] = "";

			default_value = empty_variable;
		}

		variable_ptr = default_value;
	}

	length = strlen(variable_ptr);

	variable = malloc(sizeof(char) * (length + 1));

	if (variable == NULL)
	{
		return NULL;
	}

	strncpy(variable, variable_ptr, length);

	variable[length] = '\0';

	return variable;
}